

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

testing_base testing_new(int argc,char **argv,int flags)

{
  int iVar1;
  int iVar2;
  testing_base tb_00;
  char *pcVar3;
  bool bVar4;
  bool local_4a;
  char *local_48;
  char *f;
  char *arg;
  char *last;
  testing_base tb;
  int local_20;
  int argn;
  int i;
  int flags_local;
  char **argv_local;
  int argc_local;
  
  argn = flags;
  _i = argv;
  argv_local._4_4_ = argc;
  tb_00 = (testing_base)malloc(0x78);
  memset(tb_00,0,0x78);
  tb_00->flags = argn;
  tb_00->fp = _stderr;
  tb_00->argc = argv_local._4_4_;
  tb_00->argv = _i;
  tb_00->parallelism = 1;
  tb_00->run_tests = 1;
  tb_00->is_uniprocessor = -1;
  tb_00->prog = *tb_00->argv;
  for (local_20 = 0; local_20 != 2; local_20 = local_20 + 1) {
    pcVar3 = strrchr(tb_00->prog,(int)"/\\"[local_20]);
    if (pcVar3 != (char *)0x0) {
      tb_00->prog = pcVar3 + 1;
    }
  }
  tb._4_4_ = 1;
  while( true ) {
    bVar4 = false;
    if ((tb._4_4_ != argv_local._4_4_) && (bVar4 = false, *_i[tb._4_4_] == '-')) {
      iVar1 = strcmp(_i[tb._4_4_],"--");
      bVar4 = iVar1 != 0;
    }
    iVar1 = tb._4_4_;
    if (!bVar4) break;
    pcVar3 = _i[tb._4_4_];
    local_48 = pcVar3;
    while (local_48 = local_48 + 1, *local_48 != '\0') {
      process_flag(tb_00,(int *)((long)&tb + 4),argv_local._4_4_,_i,(int)*local_48,pcVar3);
    }
    tb._4_4_ = tb._4_4_ + 1;
  }
  local_4a = false;
  if (tb._4_4_ != argv_local._4_4_) {
    iVar2 = strcmp(_i[tb._4_4_],"--");
    local_4a = iVar2 == 0;
  }
  tb_00->argn = iVar1 + (uint)local_4a;
  return tb_00;
}

Assistant:

testing_base testing_new (int argc, char *argv[], int flags) {
	static const char sep[] = { '/', '\\' };
	int i;
	int argn;
	testing_base tb = (testing_base)malloc (sizeof (*tb));
	memset ((void *) tb, 0, sizeof (*tb));
	tb->flags = flags;
	tb->fp = stderr;
	tb->argc = argc;
	tb->argv = argv;
	tb->parallelism = 1;
	tb->run_tests = 1;
	tb->is_uniprocessor = -1;
	tb->prog = tb->argv[0];
	for (i = 0; i != sizeof (sep) / sizeof (sep[0]); i++) {
		char *last = strrchr (tb->prog, sep[i]);
		if (last != NULL) {
			tb->prog = last + 1;
		}
	}
	for (argn = 1; argn != argc && argv[argn][0] == '-' &&
		       strcmp (argv[argn], "--") != 0; argn++) {
		const char *arg = argv[argn];
		const char *f;
		for (f = &arg[1]; *f != 0; f++) {
			process_flag (tb, &argn, argc, argv, *f, arg);
		}
	}
	tb->argn = argn + (argn != argc && strcmp (argv[argn], "--") == 0);
	return (tb);
}